

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void AssertEqD(double a,double b,int line)

{
  ostream *poVar1;
  
  if (ABS(a - b) < 0.0001) {
    return;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,line);
  poVar1 = std::operator<<(poVar1,"] FAIL ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a);
  poVar1 = std::operator<<(poVar1," != ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(-1);
}

Assistant:

void AssertEqD(double a, double b, int line) {
  if (std::abs(a - b) < 0.0001) {
    // OK
  } else {
    std::cout << line << "] FAIL " << a << " != " << b << std::endl;
    exit(-1);
  }
}